

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O1

idx_t duckdb::NextValid(ValidityMask *bits,idx_t j,idx_t n)

{
  unsigned_long *puVar1;
  idx_t iVar2;
  sbyte sVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  if (n <= j) {
    return n;
  }
  uVar4 = (uint)j & 0x3f;
  uVar6 = (ulong)uVar4;
  puVar1 = (bits->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    uVar7 = 0xffffffffffffffff;
  }
  else {
    uVar7 = puVar1[j >> 6];
  }
  sVar3 = (sbyte)uVar4;
  uVar7 = (uVar7 >> sVar3) << sVar3;
  uVar9 = n + 0x3f >> 6;
  uVar8 = (j >> 6) + 1;
  bVar10 = uVar8 < uVar9;
  uVar5 = uVar6;
  if (bVar10) {
    iVar2 = j;
    do {
      j = iVar2;
      uVar5 = uVar6;
      if (uVar7 != 0) {
        do {
          if ((uVar7 >> (uVar5 & 0x3f) & 1) != 0) goto LAB_016c7716;
          uVar5 = uVar5 + 1;
          j = j + 1;
        } while (uVar5 != 0x40);
      }
      j = (iVar2 - uVar6) + 0x40;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = 0xffffffffffffffff;
      }
      else {
        uVar7 = puVar1[uVar8];
      }
      uVar8 = uVar8 + 1;
      uVar6 = 0;
      bVar10 = uVar8 < uVar9;
      iVar2 = j;
      uVar5 = 0;
    } while (uVar8 != uVar9);
  }
LAB_016c7716:
  uVar6 = j;
  if ((!bVar10) && (j < n)) {
    do {
      if ((uVar7 >> (uVar5 & 0x3f) & 1) != 0) {
        return j;
      }
      uVar5 = uVar5 + 1;
      j = j + 1;
      uVar6 = n;
    } while (n != j);
  }
  return uVar6;
}

Assistant:

static idx_t NextValid(const ValidityMask &bits, idx_t j, const idx_t n) {
	if (j >= n) {
		return n;
	}

	// We can do a first approximation by checking entries one at a time
	// which gives 64:1.
	idx_t entry_idx, idx_in_entry;
	bits.GetEntryIndex(j, entry_idx, idx_in_entry);
	auto entry = bits.GetValidityEntry(entry_idx++);

	// Trim the bits before the start position
	entry &= (ValidityMask::ValidityBuffer::MAX_ENTRY << idx_in_entry);

	// Check the non-ragged entries
	for (const auto entry_count = bits.EntryCount(n); entry_idx < entry_count; ++entry_idx) {
		if (entry) {
			for (; idx_in_entry < bits.BITS_PER_VALUE; ++idx_in_entry, ++j) {
				if (bits.RowIsValid(entry, idx_in_entry)) {
					return j;
				}
			}
		} else {
			j += bits.BITS_PER_VALUE - idx_in_entry;
		}

		entry = bits.GetValidityEntry(entry_idx);
		idx_in_entry = 0;
	}

	// Check the final entry
	for (; j < n; ++idx_in_entry, ++j) {
		if (bits.RowIsValid(entry, idx_in_entry)) {
			return j;
		}
	}

	return j;
}